

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O0

void __thiscall OpenMD::SelectionEvaluator::invalidIndex(SelectionEvaluator *this,int index)

{
  SelectionEvaluator *in_RDI;
  int *in_stack_00000138;
  string *in_stack_ffffffffffffff88;
  string *__lhs;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = local_50;
  toString<int>(in_stack_00000138);
  std::operator+((char *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  evalError(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void invalidIndex(int index) {
      evalError("invalid index : " + toString(index));
    }